

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

ion_err_t __thiscall
Dictionary<int,_int>::initializeDictionary
          (Dictionary<int,_int> *this,ion_dictionary_id_t dict_id,ion_key_type_t k_type,
          ion_key_size_t k_size,ion_value_size_t v_size,ion_dictionary_size_t dictionary_size)

{
  ion_err_t iVar1;
  
  this->key_type = k_type;
  this->key_size = k_size;
  this->value_size = v_size;
  this->dict_size = dictionary_size;
  iVar1 = dictionary_create(&this->handler,&this->dict,dict_id,k_type,k_size,v_size,dictionary_size)
  ;
  (this->last_status).error = iVar1;
  return iVar1;
}

Assistant:

ion_err_t
initializeDictionary(
	ion_dictionary_id_t		dict_id,
	ion_key_type_t			k_type,
	ion_key_size_t			k_size,
	ion_value_size_t		v_size,
	ion_dictionary_size_t	dictionary_size
) {
	key_type	= k_type;
	key_size	= k_size;
	value_size	= v_size;
	dict_size	= dictionary_size;

	ion_err_t err = dictionary_create(&handler, &dict, dict_id, k_type, k_size, v_size, dictionary_size);

	last_status.error = err;

	return err;
}